

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

void __thiscall State::Dump(State *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  char *pcVar4;
  
  for (p_Var1 = (this->paths_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    p_Var2 = p_Var1[3]._M_nxt;
    pcVar4 = "unknown";
    if ((p_Var2[5]._M_nxt != (_Hash_node_base *)0xffffffffffffffff) &&
       (pcVar4 = "clean", *(char *)&p_Var2[6]._M_nxt != '\0')) {
      pcVar4 = "dirty";
    }
    printf("%s %s [id:%d]\n",p_Var2->_M_nxt,pcVar4,(ulong)*(uint *)&p_Var2[0xb]._M_nxt);
  }
  if ((this->pools_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    puts("resource_pools:");
    for (p_Var3 = (this->pools_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->pools_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if (((*(Pool **)(p_Var3 + 2))->name_)._M_string_length != 0) {
        Pool::Dump(*(Pool **)(p_Var3 + 2));
      }
    }
  }
  return;
}

Assistant:

void State::Dump() {
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i) {
    Node* node = i->second;
    printf("%s %s [id:%d]\n",
           node->path().c_str(),
           node->status_known() ? (node->dirty() ? "dirty" : "clean")
                                : "unknown",
           node->id());
  }
  if (!pools_.empty()) {
    printf("resource_pools:\n");
    for (map<string, Pool*>::const_iterator it = pools_.begin();
         it != pools_.end(); ++it)
    {
      if (!it->second->name().empty()) {
        it->second->Dump();
      }
    }
  }
}